

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

int parse_grammar(Grammar *g,char *pathname,char *sarg)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  char *name;
  Production *pPVar4;
  D_Parser *ap;
  size_t sVar5;
  D_ParseNode *pDVar6;
  int iVar7;
  
  ppcVar2 = (g->all_pathnames).v;
  if (ppcVar2 == (char **)0x0) {
    pcVar3 = dup_str(pathname,(char *)0x0);
    (g->all_pathnames).v = (g->all_pathnames).e;
    uVar1 = (g->all_pathnames).n;
    (g->all_pathnames).n = uVar1 + 1;
    (g->all_pathnames).e[uVar1] = pcVar3;
    goto LAB_0013d91b;
  }
  uVar1 = (g->all_pathnames).n;
  if (ppcVar2 == (g->all_pathnames).e) {
    if (2 < uVar1) goto LAB_0013d8ff;
  }
  else if ((uVar1 & 7) == 0) {
LAB_0013d8ff:
    pcVar3 = dup_str(pathname,(char *)0x0);
    vec_add_internal(&g->all_pathnames,pcVar3);
    goto LAB_0013d91b;
  }
  pcVar3 = dup_str(pathname,(char *)0x0);
  uVar1 = (g->all_pathnames).n;
  (g->all_pathnames).n = uVar1 + 1;
  (g->all_pathnames).v[uVar1] = pcVar3;
LAB_0013d91b:
  pcVar3 = sarg;
  if ((sarg == (char *)0x0) && (pcVar3 = sbuf_read(pathname), pcVar3 == (char *)0x0)) {
    return -1;
  }
  if ((g->productions).n == 0) {
    name = dup_str("0 Start",(char *)0x0);
    pPVar4 = new_production(g,name);
    pPVar4->field_0x3c = pPVar4->field_0x3c & 0xe3 | 4;
  }
  ap = new_D_Parser((D_ParserTables *)&parser_tables_dparser_gram,0x20);
  ap->initial_globals = g;
  (ap->loc).pathname = pathname;
  sVar5 = strlen(pcVar3);
  pDVar6 = dparse(ap,pcVar3,(int)sVar5);
  if (pDVar6 == (D_ParseNode *)0x0) {
    iVar7 = -1;
  }
  else {
    iVar7 = 0;
    if (1 < (g->productions).n) {
      finish_productions(g);
      iVar7 = 0;
    }
  }
  if (sarg == (char *)0x0) {
    free(pcVar3);
  }
  free_D_Parser(ap);
  return iVar7;
}

Assistant:

int parse_grammar(Grammar *g, char *pathname, char *sarg) {
  D_Parser *p;
  int res = 0;
  char *s = sarg;

  vec_add(&g->all_pathnames, dup_str(pathname, 0));
  if (!s)
    if (!(s = sbuf_read(pathname))) return -1;
  if (!g->productions.n) initialize_productions(g);
  p = new_D_Parser(&parser_tables_dparser_gram, sizeof(D_ParseNode_User));
  p->initial_globals = g;
  p->loc.pathname = pathname;
  if (dparse(p, s, strlen(s))) {
    if (g->productions.n > 1) finish_productions(g);
  } else
    res = -1;
  if (!sarg) FREE(s);
  free_D_Parser(p);
  return res;
}